

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

int tcv_get_voltage(tcv_t *tcv,uint16_t *vcc)

{
  _func_int_tcv_t_ptr_uint16_t_ptr *p_Var1;
  _Bool _Var2;
  int iVar3;
  
  _Var2 = tcv_check_and_lock_ok(tcv);
  if (vcc == (uint16_t *)0x0 || !_Var2) {
    iVar3 = -4;
  }
  else {
    p_Var1 = tcv->fun->get_voltage;
    if (p_Var1 == (_func_int_tcv_t_ptr_uint16_t_ptr *)0x0) {
      iVar3 = -0xc;
    }
    else {
      iVar3 = (*p_Var1)(tcv,vcc);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar3;
}

Assistant:

int tcv_get_voltage(tcv_t* tcv, uint16_t* vcc)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !vcc)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_voltage)
		ret = tcv->fun->get_voltage(tcv, vcc);

	tcv_unlock(tcv);
	return ret;

}